

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.h
# Opt level: O0

void perfetto::internal::TrackEventInternal::WriteTrackDescriptor<perfetto::Track>
               (Track *track,TraceWriterBase *trace_writer,TrackEventIncrementalState *incr_state,
               TrackEventTlsState *tls_state,TraceTimestamp *timestamp)

{
  TraceWriterBase *track_00;
  TrackRegistry *this;
  TraceTimestamp timestamp_00;
  undefined4 local_48;
  TraceWriterBase local_38;
  TraceTimestamp *local_30;
  TraceTimestamp *timestamp_local;
  TrackEventTlsState *tls_state_local;
  TrackEventIncrementalState *incr_state_local;
  TraceWriterBase *trace_writer_local;
  Track *track_local;
  
  local_30 = timestamp;
  timestamp_local = (TraceTimestamp *)tls_state;
  tls_state_local = (TrackEventTlsState *)incr_state;
  incr_state_local = (TrackEventIncrementalState *)trace_writer;
  trace_writer_local = (TraceWriterBase *)track;
  ResetIncrementalStateIfRequired(trace_writer,incr_state,tls_state,timestamp);
  this = TrackRegistry::Get();
  track_00 = trace_writer_local;
  local_48 = (undefined4)*(undefined8 *)local_30;
  timestamp_00.value._0_4_ = local_48;
  timestamp_00._0_8_ = timestamp_local;
  timestamp_00.value._4_4_ = 0;
  NewTracePacket(&local_38,incr_state_local,tls_state_local,timestamp_00,(uint32_t)local_30->value);
  TrackRegistry::SerializeTrack<perfetto::Track>
            (this,(Track *)track_00,
             (MessageHandle<perfetto::protos::pbzero::TracePacket> *)&local_38);
  protozero::MessageHandle<perfetto::protos::pbzero::TracePacket>::~MessageHandle
            ((MessageHandle<perfetto::protos::pbzero::TracePacket> *)&local_38);
  return;
}

Assistant:

static void WriteTrackDescriptor(const TrackType& track,
                                   TraceWriterBase* trace_writer,
                                   TrackEventIncrementalState* incr_state,
                                   const TrackEventTlsState& tls_state,
                                   const TraceTimestamp& timestamp) {
    ResetIncrementalStateIfRequired(trace_writer, incr_state, tls_state,
                                    timestamp);
    TrackRegistry::Get()->SerializeTrack(
        track, NewTracePacket(trace_writer, incr_state, tls_state, timestamp));
  }